

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O1

String * __thiscall asl::Directory::name(String *__return_storage_ptr__,Directory *this)

{
  Path local_28;
  
  Path::Path(&local_28,&this->_path);
  Path::name(__return_storage_ptr__,&local_28);
  if (local_28._path._size != 0) {
    free(local_28._path.field_2._str);
  }
  return __return_storage_ptr__;
}

Assistant:

String Directory::name() const
{
	return Path(_path).name();
}